

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

char * __thiscall asmjit::Zone::sformat(Zone *this,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  Zone *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  size_t len;
  char buf [512];
  undefined1 local_2e8 [16];
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined4 local_238;
  undefined4 local_234;
  undefined1 *local_230;
  undefined1 *local_228;
  long local_220;
  char local_218 [512];
  char *local_18;
  Zone *local_10;
  char *local_8;
  
  if (in_AL != '\0') {
    local_2b8 = in_XMM0_Qa;
    local_2a8 = in_XMM1_Qa;
    local_298 = in_XMM2_Qa;
    local_288 = in_XMM3_Qa;
    local_278 = in_XMM4_Qa;
    local_268 = in_XMM5_Qa;
    local_258 = in_XMM6_Qa;
    local_248 = in_XMM7_Qa;
  }
  if (in_RSI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    local_228 = local_2e8;
    local_230 = &stack0x00000008;
    local_234 = 0x30;
    local_238 = 0x10;
    local_2d8 = in_RDX;
    local_2d0 = in_RCX;
    local_2c8 = in_R8;
    local_2c0 = in_R9;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar1 = vsnprintf(local_218,0x1ff,in_RSI,&local_238);
    local_220 = (long)iVar1 + 1;
    local_218[iVar1] = '\0';
    iVar1 = dup(in_RDI,(int)local_218);
    local_8 = (char *)CONCAT44(extraout_var,iVar1);
  }
  return local_8;
}

Assistant:

char* Zone::sformat(const char* fmt, ...) noexcept {
  if (ASMJIT_UNLIKELY(!fmt)) return nullptr;

  char buf[512];
  size_t len;

  va_list ap;
  va_start(ap, fmt);

  len = vsnprintf(buf, ASMJIT_ARRAY_SIZE(buf) - 1, fmt, ap);
  buf[len++] = 0;

  va_end(ap);
  return static_cast<char*>(dup(buf, len));
}